

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryOperator.cpp
# Opt level: O1

ptr<Value> __thiscall BinaryOperator::evaluate(BinaryOperator *this,Environment *env)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ptr<Value> pVar3;
  ptr<Value> rightValue;
  ptr<Value> leftValue;
  undefined1 auStack_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_bucket_count)(local_28);
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_element_count)(auStack_38);
  plVar1 = (long *)(env->symbols)._M_h._M_rehash_policy._M_next_resize;
  (**(code **)(*plVar1 + 0x30))(this,plVar1,local_28,auStack_38);
  _Var2._M_pi = extraout_RDX;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var2._M_pi = extraout_RDX_01;
  }
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> BinaryOperator::evaluate(Environment* env) {
    ptr<Value> leftValue = leftExpression->evaluate(env);
    ptr<Value> rightValue = rightExpression->evaluate(env);

    ptr<Value> result = operation -> getResult(leftValue, rightValue);
    return result;
}